

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

bool __thiscall
glcts::ViewportArray::DepthRangeDepthTest::checkResults
          (DepthRangeDepthTest *this,texture *texture_0,texture *param_2,GLuint draw_call_index)

{
  ostringstream *this_00;
  float fVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  float fVar8;
  vector<float,_std::allocator<float>_> texture_data;
  vector<float,_std::allocator<float>_> local_208;
  double local_1f0;
  float local_1e8;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize(&local_208,0x20);
  Utils::texture::get(texture_0,0x1903,0x1406,
                      local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
  fVar8 = (float)draw_call_index * 0.0625;
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1f0 = (double)fVar8;
  bVar6 = true;
  lVar5 = 0;
  local_1e8 = fVar8;
  do {
    fVar1 = local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5];
    local_1c8 = ZEXT416((uint)fVar1);
    fVar2 = local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5 + 0x10];
    bVar3 = fVar8 <= fVar1;
    local_1d8 = ZEXT416((uint)fVar2);
    bVar4 = fVar8 <= fVar2;
    if (bVar4 || bVar3) {
      local_1b0._0_8_ = ((this->super_DrawTestBase).super_TestCaseBase.m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Invalid values at ",0x12);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," depth value ",0xd);
      std::ostream::_M_insert<double>(local_1f0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," got [",6);
      std::ostream::_M_insert<double>((double)(float)local_1c8._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      std::ostream::_M_insert<double>((double)(float)local_1d8._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      bVar6 = false;
      fVar8 = local_1e8;
    }
    bVar7 = lVar5 != 0xf;
    lVar5 = lVar5 + 1;
  } while ((!bVar4 && !bVar3) && bVar7);
  if (local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar6;
}

Assistant:

bool DepthRangeDepthTest::checkResults(Utils::texture& texture_0, Utils::texture& /* texture_1 */,
									   GLuint		   draw_call_index)
{
	static const GLfloat step = 1.0f / 16.0f;

	const GLfloat depth_value = step * (GLfloat)draw_call_index;

	bool check_result = true;

	std::vector<GLfloat> texture_data;
	texture_data.resize(m_r32f_width * m_r32f_height);
	texture_0.get(GL_RED, GL_FLOAT, &texture_data[0]);

	for (GLuint i = 0; i < 16; ++i)
	{
		/* Bottom row should contain near values, top one should contain far values */
		const GLfloat near = texture_data[i];
		const GLfloat far  = texture_data[i + 16];

		if ((depth_value <= near) || (depth_value <= far))
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid values at " << i << " depth value "
												<< depth_value << " got [" << near << ", " << far << "]"
												<< tcu::TestLog::EndMessage;

			check_result = false;
			break;
		}
	}

	return check_result;
}